

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condensation.cpp
# Opt level: O3

Clause * __thiscall Inferences::Condensation::simplify(Condensation *this,Clause *cl)

{
  long *plVar1;
  List<Kernel::Literal_*> *pLVar2;
  uint uVar3;
  uint uVar4;
  Clause *pCVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  List<Kernel::Literal_*> **ppLVar10;
  Literal *pLVar11;
  List<Kernel::Literal_*> *pLVar12;
  ulong uVar13;
  Literal **ppLVar14;
  uint i_1;
  uint uVar15;
  ulong uVar16;
  uint baseLen;
  uint uVar17;
  Literal **res;
  Entry *pEVar18;
  uint i;
  SubstIterator sit;
  InstanceIterator iit;
  LiteralMiniIndex cmi;
  RobSubstitution subst0;
  ulong local_1c8;
  undefined1 local_1c0 [24];
  IteratorBase local_1a8;
  Clause *local_188;
  Entry *local_180;
  ulong local_178;
  RobSubstitution *local_170;
  FixedSizeAllocator<16UL> *local_168;
  Entry *local_160;
  Entry *local_158;
  Entry *local_150;
  LiteralMiniIndex local_148;
  Inference local_128;
  RobSubstitution local_f8;
  
  local_1c0._8_8_ = *(undefined8 *)&cl->field_0x38;
  uVar15 = (uint)local_1c0._8_8_ & 0xfffff;
  if (1 < uVar15) {
    if ((simplify(Kernel::Clause*)::newLits == '\0') &&
       (iVar9 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::newLits), iVar9 != 0)) {
      simplify::newLits._size = 0x20;
      simplify::newLits._capacity = 0x20;
      ppLVar14 = (Literal **)::operator_new(0x100,0x10);
      if (simplify::newLits._capacity != 0) {
        memset(ppLVar14,0,simplify::newLits._capacity << 3);
      }
      simplify::newLits._array = ppLVar14;
      __cxa_atexit(Lib::DArray<Kernel::Literal_*>::~DArray,&simplify::newLits,&__dso_handle);
      __cxa_guard_release(&simplify(Kernel::Clause*)::newLits);
    }
    if ((simplify(Kernel::Clause*)::alts == '\0') &&
       (iVar9 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::alts), iVar9 != 0)) {
      simplify::alts._size = 0x20;
      simplify::alts._capacity = 0x20;
      ppLVar10 = (List<Kernel::Literal_*> **)::operator_new(0x100,0x10);
      if (simplify::alts._capacity != 0) {
        memset(ppLVar10,0,simplify::alts._capacity << 3);
      }
      simplify::alts._array = ppLVar10;
      __cxa_atexit(Lib::DArray<Lib::List<Kernel::Literal_*>_*>::~DArray,&simplify::alts,
                   &__dso_handle);
      __cxa_guard_release(&simplify(Kernel::Clause*)::alts);
    }
    baseLen = uVar15 - 1;
    Indexing::LiteralMiniIndex::LiteralMiniIndex(&local_148,cl);
    uVar13 = (ulong)baseLen;
    local_1c0._8_8_ = ZEXT48((uint)local_1c0._8_8_ & 0xfffff);
    pEVar18 = (Entry *)0x0;
    uVar17 = 1;
    local_160 = (Entry *)(uVar13 * 8);
    local_168 = (FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
    local_178 = uVar13;
    do {
      uVar8 = uVar17 + 1;
      uVar3 = (uint)pEVar18;
      uVar4 = uVar3 + 2;
      if (uVar8 != uVar15) {
        uVar4 = uVar8;
      }
      if (uVar3 != uVar17) {
        local_180 = (Entry *)cl->_literals[(int)uVar3];
        pLVar11 = cl->_literals[(int)uVar17];
        local_1c0._20_4_ = uVar4;
        Lib::DArray<Kernel::Literal_*>::ensure(&simplify::newLits,uVar13);
        Kernel::RobSubstitution::RobSubstitution(&local_f8);
        Kernel::RobSubstitution::unifiers
                  ((RobSubstitution *)local_1c0,(Literal *)&local_f8,(int)local_180,(Literal *)0x0,
                   (int)pLVar11,false);
        local_150 = (Entry *)(ulong)uVar17;
        local_158 = pEVar18;
        do {
          cVar6 = (**(code **)(*(long *)local_1c0._0_8_ + 0x10))();
          if (cVar6 == '\0') goto LAB_004bc234;
          local_170 = (RobSubstitution *)(**(code **)(*(long *)local_1c0._0_8_ + 0x18))();
          Lib::DArray<Lib::List<Kernel::Literal_*>_*>::ensure(&simplify::alts,uVar13);
          ppLVar10 = (List<Kernel::Literal_*> **)((long)simplify::alts._array + (long)local_160);
          do {
            ppLVar10[-1] = (List<Kernel::Literal_*> *)0x0;
            ppLVar10 = ppLVar10 + -1;
          } while (ppLVar10 != simplify::alts._array);
          pLVar11 = Kernel::RobSubstitution::apply(local_170,(Literal *)local_180,0);
          *simplify::newLits._array = pLVar11;
          Indexing::LiteralMiniIndex::IteratorBase::IteratorBase
                    (&local_1a8,&local_148,pLVar11,false);
          bVar7 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                            ((InstanceIterator *)&local_1a8);
          if (bVar7) {
            while (bVar7 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                     ((InstanceIterator *)&local_1a8),
                  ppLVar10 = simplify::alts._array, bVar7) {
              local_1a8._ready = false;
              pLVar11 = (local_1a8._curr)->_lit;
              pLVar2 = *simplify::alts._array;
              local_1a8._curr = local_1a8._curr + 1;
              pLVar12 = (List<Kernel::Literal_*> *)Lib::FixedSizeAllocator<16UL>::alloc(local_168);
              pLVar12->_head = pLVar11;
              pLVar12->_tail = pLVar2;
              *ppLVar10 = pLVar12;
            }
            local_1c8 = 1;
            pEVar18 = (Entry *)0x0;
            do {
              if (pEVar18 != local_150 && pEVar18 != local_158) {
                pLVar11 = Kernel::RobSubstitution::apply(local_170,cl->_literals[(long)pEVar18],0);
                simplify::newLits._array[local_1c8] = pLVar11;
                Indexing::LiteralMiniIndex::IteratorBase::IteratorBase
                          (&local_1a8,&local_148,pLVar11,false);
                bVar7 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                  ((InstanceIterator *)&local_1a8);
                uVar13 = local_178;
                if (!bVar7) goto LAB_004bc19e;
                while (bVar7 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                         ((InstanceIterator *)&local_1a8),
                      ppLVar10 = simplify::alts._array, bVar7) {
                  local_1a8._ready = false;
                  pLVar11 = (local_1a8._curr)->_lit;
                  pLVar2 = simplify::alts._array[local_1c8];
                  local_1a8._curr = local_1a8._curr + 1;
                  pLVar12 = (List<Kernel::Literal_*> *)
                            Lib::FixedSizeAllocator<16UL>::alloc(local_168);
                  pLVar12->_head = pLVar11;
                  pLVar12->_tail = pLVar2;
                  ppLVar10[local_1c8] = pLVar12;
                }
                local_1c8 = (ulong)((int)local_1c8 + 1);
                uVar13 = local_178;
              }
              pEVar18 = (Entry *)((long)&pEVar18->field_0 + 1);
            } while (pEVar18 != (Entry *)local_1c0._8_8_);
            bVar7 = Kernel::MLMatcher::canBeMatched
                              (simplify::newLits._array,baseLen,cl,simplify::alts._array,
                               (Literal *)0x0,false);
          }
          else {
LAB_004bc19e:
            bVar7 = false;
          }
          uVar16 = 0;
          do {
            pLVar2 = simplify::alts._array[uVar16];
            while (pLVar12 = pLVar2, pLVar12 != (List<Kernel::Literal_*> *)0x0) {
              pLVar12->_head = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              pLVar2 = pLVar12->_tail;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pLVar12;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar13);
        } while (bVar7 == false);
        *(int *)(DAT_00b521c0 + 0x16c) = *(int *)(DAT_00b521c0 + 0x16c) + 1;
        ppLVar14 = simplify::newLits._array;
        local_1a8._ready = true;
        local_1a8._query = (Literal *)cl;
        Kernel::Inference::Inference(&local_128,(SimplifyingInference1 *)&local_1a8);
        local_188 = Kernel::Clause::fromArray(ppLVar14,baseLen,&local_128);
LAB_004bc234:
        if ((long *)local_1c0._0_8_ != (long *)0x0) {
          plVar1 = (long *)(local_1c0._0_8_ + 8);
          *(int *)plVar1 = (int)*plVar1 + -1;
          if ((int)*plVar1 == 0) {
            (**(code **)(*(long *)local_1c0._0_8_ + 8))();
          }
        }
        Kernel::RobSubstitution::~RobSubstitution(&local_f8);
        uVar4 = local_1c0._20_4_;
        pCVar5 = local_188;
        if (cVar6 != '\0') break;
      }
      uVar17 = uVar4;
      pEVar18 = (Entry *)(ulong)(uVar3 + (uVar8 == uVar15));
      pCVar5 = cl;
    } while (uVar17 != uVar15);
    local_188 = pCVar5;
    cl = local_188;
    if (local_148._entries._array != (Entry *)0x0) {
      uVar13 = local_148._entries._capacity << 4;
      if (uVar13 == 0) {
        (local_148._entries._array)->_header = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        (local_148._entries._array)->_weight = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_148._entries._array;
      }
      else if (uVar13 < 0x11) {
        (local_148._entries._array)->_header = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        (local_148._entries._array)->_weight = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_148._entries._array;
      }
      else if (uVar13 < 0x19) {
        (local_148._entries._array)->_header = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        (local_148._entries._array)->_weight = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_148._entries._array;
      }
      else if (uVar13 < 0x21) {
        (local_148._entries._array)->_header = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        (local_148._entries._array)->_weight = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_148._entries._array;
      }
      else if (uVar13 < 0x31) {
        (local_148._entries._array)->_header = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        (local_148._entries._array)->_weight = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_148._entries._array;
      }
      else if (uVar13 < 0x41) {
        (local_148._entries._array)->_header = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        (local_148._entries._array)->_weight = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_148._entries._array;
      }
      else {
        operator_delete(local_148._entries._array,0x10);
        cl = local_188;
      }
    }
  }
  return cl;
}

Assistant:

Clause* Condensation::simplify(Clause* cl)
{
  TIME_TRACE("condensation");

  unsigned clen=cl->length();
  if(clen<=1) {
    return cl;
  }
  unsigned newLen=clen-1;

  // stores newLen new literals
  static DArray<Literal*> newLits(32);
  //
  static DArray<LiteralList*> alts(32);

  LiteralMiniIndex cmi(cl);

  // For each pair of non-equal literals l1 and l2
  //
  CombinationIterator<unsigned> pairIt(0, clen);
  while(pairIt.hasNext()) {
    pair<unsigned,unsigned> lpair=pairIt.next();
    unsigned l1Index=lpair.first;
    unsigned l2Index=lpair.second;
    if(l1Index==l2Index) {
      continue;
    }
    Literal* l1=(*cl)[l1Index];
    Literal* l2=(*cl)[l2Index];

    newLits.ensure(newLen);

    RobSubstitution subst0;
    // For each unifying subst of l1 and l2
    // apply the subst to l1 and search for instances of this in the clause
    // (note that this is symmetric to applying subst to l2)
    SubstIterator sit=subst0.unifiers(l1,0,l2,0,false);
    while(sit.hasNext()) {
      RobSubstitution* subst=sit.next();
      alts.init(newLen,0);
      bool success=false;

      unsigned next=0;
      {
        Literal* lit=subst->apply(l1,0);
        newLits[next] = lit;
        // Use lit as a query to find instances of it in cmi (i.e. the clause)
        LiteralMiniIndex::InstanceIterator iit(cmi, lit, false);
        if(!iit.hasNext()) {
          // If there are no instances then finish
          goto match_fin;
        }
        // Store all instances in alts (alts[next] is a literal list)
        while(iit.hasNext()) {
	    LiteralList::push(iit.next(), alts[next]);
        }
        next++;
      }

      // For all literals that are not l1 or l2
      // apply the subst and search for instances of the result as before
      for(unsigned i=0;i<clen;i++) {
        if(i!=l1Index && i!=l2Index) {
          Literal* lit=subst->apply((*cl)[i],0);
          newLits[next] = lit;
          LiteralMiniIndex::InstanceIterator iit(cmi, lit, false);
          if(!iit.hasNext()) {
            goto match_fin;
          }
          while(iit.hasNext()) {
	    LiteralList::push(iit.next(), alts[next]);
          }
          next++;
        }
      }

      // I think this is asking if there is a substitution that will match
      // each lit in newLits with one of its instances in alts
      // CHECK!
      success=MLMatcher::canBeMatched(newLits.array(), newLen, cl,alts.array(),0,false);

    // We will jump here if we do not find a match, in this case success will be false
    match_fin:
      for(unsigned i=0;i<newLen;i++) {
        LiteralList::destroy(alts[i]);
      }

      if(success) {
        env.statistics->condensations++;
        return Clause::fromArray(newLits.begin(), newLen, SimplifyingInference1(InferenceRule::CONDENSATION, cl));
      }
    }
  }
  return cl;
}